

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::testQueriesForInvalidNameOfObject
          (ErrorsTest *this)

{
  char cVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_e78;
  MessageBuilder local_e68;
  MessageBuilder local_ce8;
  GetNameFunc local_b68;
  int local_b60;
  Enum<int,_2UL> local_b58;
  MessageBuilder local_b48;
  GetNameFunc local_9c8;
  int local_9c0;
  Enum<int,_2UL> local_9b8;
  MessageBuilder local_9a8;
  MessageBuilder local_828;
  GetNameFunc local_6a8;
  int local_6a0;
  Enum<int,_2UL> local_698;
  MessageBuilder local_688;
  GetNameFunc local_508;
  int local_500;
  Enum<int,_2UL> local_4f8;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLenum error;
  GLint64 buffer64;
  GLint buffer;
  GLuint invalid_name;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _buffer = CONCAT44(extraout_var,iVar2);
  buffer64._4_4_ = 0;
  do {
    buffer64._4_4_ = buffer64._4_4_ + 1;
    cVar1 = (**(code **)(_buffer + 0xcd0))();
  } while (cVar1 == '\x01');
  buffer64._0_4_ = 0x4cb2f;
  lStack_30 = 0x4cb2f;
  local_34 = 0;
  (*this->m_gl_getTransformFeedbackiv)(buffer64._4_4_,0x8e23,(GLint *)&buffer64);
  local_34 = (**(code **)(_buffer + 0x800))();
  if (local_34 == 0x502) {
    if ((int)buffer64 == 0x4cb2f) {
      local_34 = 0x502;
      while (local_34 = (**(code **)(_buffer + 0x800))(), local_34 != 0) {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_4e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_4e8,
                            (char (*) [122])
                            "Warning! glGetTransformFeedbackiv called with invalid object name has generated more than one error, The next error was  "
                           );
        EVar7 = glu::getErrorStr(local_34);
        local_508 = EVar7.m_getName;
        local_500 = EVar7.m_value;
        local_4f8.m_getName = local_508;
        local_4f8.m_value = local_500;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4f8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4e8);
      }
      (*this->m_gl_getTransformFeedbacki_v)(buffer64._4_4_,0x8c8f,0,(GLint *)&buffer64);
      local_34 = (**(code **)(_buffer + 0x800))();
      if (local_34 == 0x502) {
        if ((int)buffer64 == 0x4cb2f) {
          local_34 = 0x502;
          while (local_34 = (**(code **)(_buffer + 0x800))(), local_34 != 0) {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_9a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_9a8,
                                (char (*) [136])
                                "Warning! glGetTransformFeedbacki_v called with invalid object name has unexpectedly generated more than one error, The next error was  "
                               );
            EVar7 = glu::getErrorStr(local_34);
            local_9c8 = EVar7.m_getName;
            local_9c0 = EVar7.m_value;
            local_9b8.m_getName = local_9c8;
            local_9b8.m_value = local_9c0;
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9b8);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_9a8);
          }
          (*this->m_gl_getTransformFeedbacki64_v)(buffer64._4_4_,0x8c84,0,&stack0xffffffffffffffd0);
          local_34 = (**(code **)(_buffer + 0x800))();
          if (local_34 == 0x502) {
            if (lStack_30 == 0x4cb2f) {
              local_34 = 0x502;
              while (local_34 = (**(code **)(_buffer + 0x800))(), local_34 != 0) {
                pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                pTVar5 = tcu::TestContext::getLog(pTVar4);
                tcu::TestLog::operator<<
                          (&local_e68,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (&local_e68,
                                    (char (*) [138])
                                    "Warning! glGetTransformFeedbacki64_v called with invalid object name has unexpectedly generated more than one error, The next error was  "
                                   );
                EVar7 = glu::getErrorStr(local_34);
                local_e78.m_getName = EVar7.m_getName;
                local_e78.m_value = EVar7.m_value;
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_e78);
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
                tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_e68);
              }
              this_local._7_1_ = true;
            }
            else {
              pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
              pTVar5 = tcu::TestContext::getLog(pTVar4);
              tcu::TestLog::operator<<
                        (&local_ce8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_ce8,
                                  (char (*) [110])
                                  "glGetTransformFeedbacki64_v called with invalid object name had been expected not to change the given buffer."
                                 );
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_ce8);
              this_local._7_1_ = false;
            }
          }
          else {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_b48,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_b48,
                                (char (*) [122])
                                "glGetTransformFeedbacki64_v called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                               );
            EVar7 = glu::getErrorStr(local_34);
            local_b68 = EVar7.m_getName;
            local_b60 = EVar7.m_value;
            local_b58.m_getName = local_b68;
            local_b58.m_value = local_b60;
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_b58);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" was captured.");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_b48);
            this_local._7_1_ = false;
          }
        }
        else {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<(&local_828,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_828,
                              (char (*) [108])
                              "glGetTransformFeedbacki_v called with invalid object name had been expected not to change the given buffer."
                             );
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_828);
          this_local._7_1_ = false;
        }
      }
      else {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_688,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_688,
                            (char (*) [120])
                            "glGetTransformFeedbacki_v called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                           );
        EVar7 = glu::getErrorStr(local_34);
        local_6a8 = EVar7.m_getName;
        local_6a0 = EVar7.m_value;
        local_698.m_getName = local_6a8;
        local_698.m_value = local_6a0;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_698);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" was captured.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_688);
        this_local._7_1_ = false;
      }
    }
    else {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_368,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_368,
                          (char (*) [107])
                          "glGetTransformFeedbackiv called with invalid object name had been expected not to change the given buffer."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [119])
                        "glGetTransformFeedbackiv called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                       );
    EVar7 = glu::getErrorStr(local_34);
    local_1e8 = EVar7.m_getName;
    local_1e0 = EVar7.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" was captured.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ErrorsTest::testQueriesForInvalidNameOfObject()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generating not a-TransformFeedback name. */
	glw::GLuint invalid_name = 0;

	while (GL_TRUE == gl.isTransformFeedback(++invalid_name))
		;

	/* Dummy storage. */
	glw::GLint   buffer   = 314159;
	glw::GLint64 buffer64 = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbackiv(invalid_name, GL_TRANSFORM_FEEDBACK_PAUSED, &buffer);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbackiv called with invalid object name has "
											   "generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki_v. */
	m_gl_getTransformFeedbacki_v(invalid_name, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, 0, &buffer);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki_v called with invalid object name has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki64_v. */
	m_gl_getTransformFeedbacki64_v(invalid_name, GL_TRANSFORM_FEEDBACK_BUFFER_START, 0, &buffer64);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer64)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki64_v called with invalid object name "
											   "has unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	return true;
}